

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O0

void __thiscall PClassActor::DeriveData(PClassActor *this,PClass *newclass)

{
  undefined2 uVar1;
  bool bVar2;
  PType *this_00;
  PSymbolTable *this_01;
  PClassActor *newa;
  PClass *newclass_local;
  PClassActor *this_local;
  
  bVar2 = DObject::IsKindOf((DObject *)newclass,RegistrationInfo.MyClass);
  if (!bVar2) {
    __assert_fail("newclass->IsKindOf(RUNTIME_CLASS(PClassActor))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/info.cpp"
                  ,0x119,"virtual void PClassActor::DeriveData(PClass *)");
  }
  FString::operator=((FString *)
                     &newclass[1].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
                      Symbols.Symbols.Size,&this->Obituary);
  FString::operator=((FString *)
                     &newclass[1].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
                      Conversions,&this->HitObituary);
  *(double *)
   &newclass[1].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.Conversions.Most =
       this->DeathHeight;
  newclass[1].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.PredType =
       (PType *)this->BurnHeight;
  *(anon_union_4_2_12391d7c_for_PalEntry_0 *)
   &newclass[1].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.VisitNext =
       (this->BloodColor).field_0;
  *(int *)((long)&newclass[1].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
                  VisitNext + 4) = this->GibHealth;
  uVar1 = *(undefined2 *)((long)&this->WoundHealth + 2);
  newclass[1].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.PredConv =
       *(undefined2 *)&this->WoundHealth;
  newclass[1].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.Distance = uVar1;
  *(int *)&newclass[1].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.field_0x7c =
       this->PoisonDamage;
  newclass[1].super_PStruct.super_PNamedType.Outer = (DObject *)this->FastSpeed;
  *(double *)&newclass[1].super_PStruct.super_PNamedType.TypeName = this->RDFactor;
  newclass[1].super_PStruct.Fields.Array = (PField **)this->CameraHeight;
  FSoundID::operator=((FSoundID *)&newclass[1].super_PStruct.Fields.Most,&this->HowlSound);
  FName::operator=((FName *)&newclass[1].super_PStruct.Fields.Count,&this->BloodType);
  FName::operator=((FName *)&newclass[1].SpecialInits,&this->BloodType2);
  FName::operator=((FName *)((long)&newclass[1].SpecialInits.Array + 4),&this->BloodType3);
  newclass[1].Pointers = (size_t *)this->distancecheck;
  *(DDropItem **)&newclass[1].SpecialInits.Most = this->DropItems;
  *(byte *)&newclass[1].FlatPointers = this->DontHurtShooter & 1;
  *(int *)((long)&newclass[1].FlatPointers + 4) = this->ExplosionRadius;
  *(int *)&newclass[1].Defaults = this->ExplosionDamage;
  *(int *)((long)&newclass[1].Defaults + 4) = this->MeleeDamage;
  FSoundID::operator=((FSoundID *)&newclass[1].bRuntimeClass,&this->MeleeSound);
  FName::operator=((FName *)&newclass[1].field_0xd4,&this->MissileName);
  newclass[1].ConstructNative = (_func_void_void_ptr *)this->MissileHeight;
  TArray<PClassPlayerPawn_*,_PClassPlayerPawn_*>::operator=
            ((TArray<PClassPlayerPawn_*,_PClassPlayerPawn_*> *)
             &newclass[1].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.Symbols.
              Symbols,&this->VisibleToPlayerClass);
  if (this->DamageFactors != (DmgFactors *)0x0) {
    this_00 = (PType *)operator_new(0x18);
    DmgFactors::DmgFactors((DmgFactors *)this_00);
    newclass[1].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.HashNext = this_00;
    DmgFactors::operator=
              ((DmgFactors *)
               newclass[1].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.HashNext,
               this->DamageFactors);
  }
  if (this->PainChances != (PainChanceList *)0x0) {
    this_01 = (PSymbolTable *)operator_new(0x18);
    TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_>::TMap
              ((TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_> *)this_01);
    newclass[1].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.Symbols.
    ParentSymbolTable = this_01;
    TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_>::operator=
              ((TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_> *)
               newclass[1].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.Symbols.
               ParentSymbolTable,this->PainChances);
  }
  return;
}

Assistant:

void PClassActor::DeriveData(PClass *newclass)
{
	assert(newclass->IsKindOf(RUNTIME_CLASS(PClassActor)));
	PClassActor *newa = static_cast<PClassActor *>(newclass);

	newa->Obituary = Obituary;
	newa->HitObituary = HitObituary;
	newa->DeathHeight = DeathHeight;
	newa->BurnHeight = BurnHeight;
	newa->BloodColor = BloodColor;
	newa->GibHealth = GibHealth;
	newa->WoundHealth = WoundHealth;
	newa->PoisonDamage = PoisonDamage;
	newa->FastSpeed = FastSpeed;
	newa->RDFactor = RDFactor;
	newa->CameraHeight = CameraHeight;
	newa->HowlSound = HowlSound;
	newa->BloodType = BloodType;
	newa->BloodType2 = BloodType2;
	newa->BloodType3 = BloodType3;
	newa->distancecheck = distancecheck;

	newa->DropItems = DropItems;

	newa->DontHurtShooter = DontHurtShooter;
	newa->ExplosionRadius = ExplosionRadius;
	newa->ExplosionDamage = ExplosionDamage;
	newa->MeleeDamage = MeleeDamage;
	newa->MeleeSound = MeleeSound;
	newa->MissileName = MissileName;
	newa->MissileHeight = MissileHeight;

	newa->VisibleToPlayerClass = VisibleToPlayerClass;

	if (DamageFactors != NULL)
	{
		// copy damage factors from parent
		newa->DamageFactors = new DmgFactors;
		*newa->DamageFactors = *DamageFactors;
	}
	if (PainChances != NULL)
	{
		// copy pain chances from parent
		newa->PainChances = new PainChanceList;
		*newa->PainChances = *PainChances;
	}

}